

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_uint64 ma_dr_wav_target_write_size_bytes
                    (ma_dr_wav_data_format *pFormat,ma_uint64 totalFrameCount,
                    ma_dr_wav_metadata *pMetadata,ma_uint32 metadataCount)

{
  ma_uint32 mVar1;
  ulong uVar2;
  ma_dr_wav_metadata *metadata;
  undefined4 in_ECX;
  long in_RSI;
  int *in_RDI;
  double dVar3;
  ma_uint64 fileSizeBytes;
  ma_uint64 riffChunkSizeBytes;
  ma_uint64 targetDataSizeBytes;
  ma_uint64 local_38;
  ma_uint64 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffe0;
  
  dVar3 = (double)(long)(in_RSI * (ulong)(uint)in_RDI[2] * (ulong)(uint)in_RDI[4]) * 0.125;
  uVar2 = (ulong)dVar3;
  metadata = (ma_dr_wav_metadata *)
             (uVar2 | (long)(dVar3 - 9.223372036854776e+18) & (long)uVar2 >> 0x3f);
  local_38 = 0;
  mVar1 = (ma_uint32)(in_stack_ffffffffffffffd0 >> 0x20);
  if (*in_RDI == 0) {
    mVar1 = ma_dr_wav__riff_chunk_size_riff
                      (CONCAT44(in_ECX,in_stack_ffffffffffffffe0),metadata,mVar1);
    local_38 = (ulong)mVar1 + 8;
  }
  else if (*in_RDI == 2) {
    local_38 = ma_dr_wav__riff_chunk_size_w64(in_stack_ffffffffffffffd0);
  }
  else if (*in_RDI == 3) {
    local_38 = ma_dr_wav__riff_chunk_size_rf64
                         (CONCAT44(in_ECX,in_stack_ffffffffffffffe0),metadata,mVar1);
    local_38 = local_38 + 8;
  }
  return local_38;
}

Assistant:

MA_API ma_uint64 ma_dr_wav_target_write_size_bytes(const ma_dr_wav_data_format* pFormat, ma_uint64 totalFrameCount, ma_dr_wav_metadata* pMetadata, ma_uint32 metadataCount)
{
    ma_uint64 targetDataSizeBytes = (ma_uint64)((ma_int64)totalFrameCount * pFormat->channels * pFormat->bitsPerSample/8.0);
    ma_uint64 riffChunkSizeBytes;
    ma_uint64 fileSizeBytes = 0;
    if (pFormat->container == ma_dr_wav_container_riff) {
        riffChunkSizeBytes = ma_dr_wav__riff_chunk_size_riff(targetDataSizeBytes, pMetadata, metadataCount);
        fileSizeBytes = (8 + riffChunkSizeBytes);
    } else if (pFormat->container == ma_dr_wav_container_w64) {
        riffChunkSizeBytes = ma_dr_wav__riff_chunk_size_w64(targetDataSizeBytes);
        fileSizeBytes = riffChunkSizeBytes;
    } else if (pFormat->container == ma_dr_wav_container_rf64) {
        riffChunkSizeBytes = ma_dr_wav__riff_chunk_size_rf64(targetDataSizeBytes, pMetadata, metadataCount);
        fileSizeBytes = (8 + riffChunkSizeBytes);
    }
    return fileSizeBytes;
}